

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

size_t Output::VerboseNote(char16 *format,...)

{
  char in_AL;
  int iVar1;
  PAL_FILE *pPVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t sVar3;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list argptr;
  AutoCriticalSection local_18;
  AutoCriticalSection autocs;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (DAT_0145948a == '\x01') {
    local_18.cs = &s_critsect;
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    CCLock::Enter(&s_critsect.super_CCLock);
    argptr[0].overflow_arg_area = local_e8;
    argptr[0]._0_8_ = &stack0x00000008;
    local_38._0_4_ = 8;
    local_38._4_4_ = 0x30;
    pPVar2 = PAL_get_stdout(0);
    iVar1 = PAL_vfwprintf(pPVar2,format,(__va_list_tag *)local_38);
    pPVar2 = PAL_get_stdout(0);
    PAL_fflush(pPVar2);
    sVar3 = (size_t)iVar1;
    AutoCriticalSection::~AutoCriticalSection(&local_18);
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t __cdecl
Output::VerboseNote(const char16 * format, ...)
{
#ifdef ENABLE_TRACE
    if (Js::Configuration::Global.flags.Verbose)
    {
        AutoCriticalSection autocs(&s_critsect);
        va_list argptr;
        va_start(argptr, format);
        size_t size = vfwprintf(stdout, format, argptr);
        fflush(stdout);
        va_end(argptr);
        return size;
    }
#endif
    return 0;
}